

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int __thiscall fmt::v5::system_error::init(system_error *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  size_t in_RCX;
  char *in_RDX;
  unsigned_long_long in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_2
  in_R9;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  string_view message;
  undefined1 *local_480;
  char *local_478;
  undefined1 local_470 [16];
  undefined **local_460;
  undefined1 *local_458;
  long alStack_450 [2];
  undefined1 local_440 [504];
  undefined **local_248;
  undefined1 *local_240;
  long lStack_238;
  undefined8 local_230;
  undefined1 local_228 [504];
  
  *(int *)(this + 0x10) = (int)ctx;
  lStack_238 = 0;
  local_248 = &PTR_grow_001dbbb8;
  local_230 = 500;
  alStack_450[0] = 0;
  local_460 = &PTR_grow_001dbbb8;
  alStack_450[1] = 500;
  format_str.size_ = in_RCX;
  format_str.data_ = in_RDX;
  args.field_1.values_ = in_R9.values_;
  args.types_ = in_R8;
  local_458 = local_440;
  local_240 = local_228;
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_460,format_str,args,(locale_ref)0x0);
  local_480 = local_470;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_480,local_458,local_458 + alStack_450[0]);
  local_460 = &PTR_grow_001dbbb8;
  if (local_458 != local_440) {
    operator_delete(local_458);
  }
  message.size_ = (size_t)in_R9.values_;
  message.data_ = local_478;
  format_system_error((v5 *)&local_248,(buffer *)((ulong)ctx & 0xffffffff),(int)local_480,message);
  if (local_480 != local_470) {
    operator_delete(local_480);
  }
  local_460 = (undefined **)alStack_450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_460,local_240,local_240 + lStack_238);
  std::runtime_error::runtime_error((runtime_error *)&local_480,(string *)&local_460);
  std::runtime_error::operator=((runtime_error *)this,(runtime_error *)&local_480);
  iVar1 = std::runtime_error::~runtime_error((runtime_error *)&local_480);
  if (local_460 != (undefined **)alStack_450) {
    operator_delete(local_460);
    iVar1 = extraout_EAX;
  }
  local_248 = &PTR_grow_001dbbb8;
  if (local_240 != local_228) {
    operator_delete(local_240);
    iVar1 = extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

FMT_FUNC void system_error::init(
    int err_code, string_view format_str, format_args args) {
  error_code_ = err_code;
  memory_buffer buffer;
  format_system_error(buffer, err_code, vformat(format_str, args));
  std::runtime_error &base = *this;
  base = std::runtime_error(to_string(buffer));
}